

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

bool __thiscall FC_BPNN::Forward(FC_BPNN *this)

{
  value_type vVar1;
  double dVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  reference this_00;
  reference ppVar6;
  reference pvVar7;
  reference pvVar8;
  long *local_80;
  size_t finder1;
  size_t finder;
  int j;
  pair<const_unsigned_long,_Preceptron_*> *element;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int i;
  FC_BPNN *this_local;
  
  __range2._4_4_ = 0;
  while( true ) {
    sVar5 = std::
            vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
            ::size(&this->net);
    if (sVar5 <= (ulong)(long)__range2._4_4_) break;
    this_00 = std::
              vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
              ::operator[](&this->net,(long)__range2._4_4_);
    __end2 = std::
             map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
             ::begin(this_00);
    element = (pair<const_unsigned_long,_Preceptron_*> *)
              std::
              map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
              ::end(this_00);
    while( true ) {
      bVar4 = std::operator!=(&__end2,(_Self *)&element);
      if (!bVar4) break;
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator*
                         (&__end2);
      finder._4_4_ = 0;
      while( true ) {
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->layers_value,(long)__range2._4_4_);
        sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
        if (sVar5 <= (ulong)(long)finder._4_4_) break;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->layers_value,(long)__range2._4_4_);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)finder._4_4_)
        ;
        vVar1 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&ppVar6->second->input,(long)finder._4_4_);
        *pvVar8 = vVar1;
        finder._4_4_ = finder._4_4_ + 1;
      }
      uVar3 = ppVar6->first;
      if (ppVar6->second == (Preceptron *)0x0) {
        local_80 = (long *)0x0;
      }
      else {
        local_80 = (long *)__dynamic_cast(ppVar6->second,&Preceptron::typeinfo,
                                          &Preceptron_SIGMOID::typeinfo,0);
      }
      (**(code **)(*local_80 + 0x18))();
      dVar2 = ppVar6->second->output;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_value,(long)(__range2._4_4_ + 1));
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,uVar3 & 0xffffffff);
      *pvVar8 = dVar2 + *pvVar8;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator++(&__end2);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  return true;
}

Assistant:

bool FC_BPNN::Forward()
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			for (int j = 0; j < layers_value[i].size(); j++)
				element.second->input[j] = layers_value[i][j];
			size_t finder = element.first;
			size_t finder1 = finder & 0X00000000FFFFFFFF;
			dynamic_cast<Preceptron_SIGMOID*>(element.second)->Forward();
			layers_value[i + 1][finder1] += element.second->output;
		}
	}
	return true;
}